

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<float>_>::Subtract
          (TPZMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *A,
          TPZMatrix<std::complex<float>_> *res)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZMatrix<std::complex<float>_> *aBase;
  TPZMatrix<std::complex<float>_> *this_01;
  long *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  char *unaff_retaddr;
  int64_t c;
  int64_t r;
  TPZFMatrix<std::complex<float>_> *resFmat;
  TPZFMatrix<std::complex<float>_> *aFmat;
  TPZFMatrix<std::complex<float>_> *thisFmat;
  size_t in_stack_00000218;
  char *in_stack_00000220;
  complex<float> *in_stack_fffffffffffffdf8;
  long local_1c8;
  undefined1 local_48 [8];
  long local_40;
  long local_38;
  TPZMatrix<std::complex<float>_> *local_30;
  long local_28;
  TPZMatrix<std::complex<float>_> *local_20;
  long *local_18;
  TPZBaseMatrix *local_10;
  TPZBaseMatrix *msg2;
  TPZFMatrix<std::complex<float>_> *this_00;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  msg2 = in_RDI;
  iVar6 = TPZBaseMatrix::Rows(in_RDI);
  iVar7 = TPZBaseMatrix::Rows(local_10);
  if (iVar6 == iVar7) {
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    iVar7 = TPZBaseMatrix::Cols(local_10);
    if (iVar6 == iVar7) goto LAB_012a5cc9;
  }
  Error(unaff_retaddr,(char *)msg2);
LAB_012a5cc9:
  iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  this_00 = (TPZFMatrix<std::complex<float>_> *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  if (this_00 != (TPZFMatrix<std::complex<float>_> *)CONCAT44(extraout_var_00,iVar5)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<std::complex<float>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [TVar = std::complex<float>]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000220,in_stack_00000218);
  }
  (**(code **)(*local_18 + 0xf8))(local_18,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    aBase = (TPZMatrix<std::complex<float>_> *)0x0;
  }
  else {
    aBase = (TPZMatrix<std::complex<float>_> *)
            __dynamic_cast(in_RDI,&TPZMatrix<std::complex<float>>::typeinfo,
                           &TPZFMatrix<std::complex<float>>::typeinfo,0);
  }
  local_20 = aBase;
  if (local_10 == (TPZBaseMatrix *)0x0) {
    local_1c8 = 0;
  }
  else {
    local_1c8 = __dynamic_cast(local_10,&TPZMatrix<std::complex<float>>::typeinfo,
                               &TPZFMatrix<std::complex<float>>::typeinfo,0);
  }
  local_28 = local_1c8;
  if (local_18 == (long *)0x0) {
    this_01 = (TPZMatrix<std::complex<float>_> *)0x0;
  }
  else {
    this_01 = (TPZMatrix<std::complex<float>_> *)
              __dynamic_cast(local_18,&TPZMatrix<std::complex<float>>::typeinfo,
                             &TPZFMatrix<std::complex<float>>::typeinfo,0);
  }
  local_30 = this_01;
  if ((this_01 == (TPZMatrix<std::complex<float>_> *)0x0) ||
     ((local_20 != (TPZMatrix<std::complex<float>_> *)0x0 && (local_28 != 0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,local_18,local_10);
    Storage(this_01);
    Storage(this_01);
    TPZFMatrix<std::complex<float>_>::operator-=(this_00,aBase);
    TPZFMatrixRef<std::complex<float>_>::~TPZFMatrixRef
              ((TPZFMatrixRef<std::complex<float>_> *)0x12a600a);
    TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x12a6017);
  }
  else {
    for (local_38 = 0; lVar1 = local_38, iVar6 = TPZBaseMatrix::Rows(in_RDI), lVar1 < iVar6;
        local_38 = local_38 + 1) {
      for (local_40 = 0; lVar1 = local_40, iVar6 = TPZBaseMatrix::Cols(in_RDI), plVar4 = local_18,
          lVar3 = local_38, lVar2 = local_40, lVar1 < iVar6; local_40 = local_40 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_38,local_40);
        std::operator-(in_stack_fffffffffffffdf8,(complex<float> *)0x12a5f37);
        (**(code **)(*plVar4 + 0x118))(plVar4,lVar3,lVar2,local_48);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}